

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stream.cpp
# Opt level: O1

char * path(char *s)

{
  char *pcVar1;
  char *pcVar2;
  char *pcVar3;
  char *pcVar4;
  size_t sVar5;
  long lVar6;
  char *__s;
  bool bVar7;
  
  __s = s;
  do {
    pcVar1 = strchr(__s,0x26);
    if (pcVar1 != (char *)0x0) {
      *pcVar1 = '\0';
    }
    pcVar3 = __s;
    pcVar4 = __s;
    if (*__s == '<') {
      pcVar2 = strrchr(__s,0x3e);
      pcVar3 = pcVar2 + 1;
      pcVar4 = pcVar2 + 1;
      if (pcVar2 != (char *)0x0) goto LAB_0015932d;
      bVar7 = false;
    }
    else {
LAB_0015932d:
      while (__s = pcVar4, pcVar3 = strpbrk(pcVar3,"/\\"), pcVar3 != (char *)0x0) {
        *pcVar3 = '/';
        pcVar3 = pcVar3 + 1;
        pcVar4 = __s;
      }
      pcVar3 = __s + (*__s == '/');
      while (pcVar4 = strchr(pcVar3,0x2f), pcVar4 != (char *)0x0) {
        if (((pcVar3 + 1 == pcVar4) && (lVar6 = 1, *pcVar3 == '.')) ||
           (((pcVar4[1] == '.' && ((pcVar4[2] == '.' && (pcVar4[3] == '/')))) &&
            ((lVar6 = 4, pcVar3 + 2 != pcVar4 || ((*pcVar3 != '.' || (pcVar3[1] != '.')))))))) {
          sVar5 = strlen(pcVar4 + lVar6);
          memmove(pcVar3,pcVar4 + lVar6,sVar5 + 1);
          pcVar4 = pcVar3;
        }
        pcVar3 = pcVar4 + (*pcVar4 == '/');
      }
      bVar7 = pcVar1 != (char *)0x0;
      if (bVar7) {
        *pcVar1 = '&';
        __s = pcVar1 + 1;
      }
    }
    if (!bVar7) {
      return s;
    }
  } while( true );
}

Assistant:

char *path(char *s)
{
    for(char *curpart = s;;)
    {
        char *endpart = strchr(curpart, '&');
        if(endpart) *endpart = '\0';
        if(curpart[0]=='<')
        {
            char *file = strrchr(curpart, '>');
            if(!file) return s;
            curpart = file+1;
        }
        for(char *t = curpart; (t = strpbrk(t, "/\\")); *t++ = PATHDIV);
        for(char *prevdir = NULL, *curdir = curpart;;)
        {
            prevdir = curdir[0]==PATHDIV ? curdir+1 : curdir;
            curdir = strchr(prevdir, PATHDIV);
            if(!curdir) break;
            if(prevdir+1==curdir && prevdir[0]=='.')
            {
                memmove(prevdir, curdir+1, strlen(curdir+1)+1);
                curdir = prevdir;
            }
            else if(curdir[1]=='.' && curdir[2]=='.' && curdir[3]==PATHDIV)
            {
                if(prevdir+2==curdir && prevdir[0]=='.' && prevdir[1]=='.') continue;
                memmove(prevdir, curdir+4, strlen(curdir+4)+1);
                curdir = prevdir;
            }
        }
        if(endpart)
        {
            *endpart = '&';
            curpart = endpart+1;
        }
        else break;
    }
    return s;
}